

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

bool ON_IsAnnotationFractionNumber
               (double value,bool bImproperFraction,double *sign,double *proper,double *numerator,
               double *denominator)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double __x;
  double local_d8;
  double local_d0;
  double x;
  double y;
  size_t k;
  double d [10];
  double tol;
  double f;
  double i;
  double a;
  double *denominator_local;
  double *numerator_local;
  double *proper_local;
  double *sign_local;
  double dStack_18;
  bool bImproperFraction_local;
  double value_local;
  
  if (sign != (double *)0x0) {
    if (0.0 <= value) {
      local_d8 = (double)(-(ulong)(0.0 < value) & 0x3ff0000000000000);
    }
    else {
      local_d8 = -1.0;
    }
    *sign = local_d8;
  }
  if (proper != (double *)0x0) {
    *proper = 0.0;
  }
  if (numerator != (double *)0x0) {
    *numerator = value;
  }
  if (denominator != (double *)0x0) {
    *denominator = 1.0;
  }
  a = (double)denominator;
  denominator_local = numerator;
  numerator_local = proper;
  proper_local = sign;
  sign_local._7_1_ = bImproperFraction;
  dStack_18 = value;
  bVar1 = ON_IsValid(value);
  if (bVar1) {
    i = ABS(dStack_18);
    f = 0.0;
    dVar2 = modf(i,&f);
    dVar3 = i * 8.881784197001252e-16;
    if (dVar3 < dVar2) {
      memcpy(&k,&DAT_00a0a280,0x50);
      for (y = 0.0; 0.0 < d[(long)y + -1]; y = (double)((long)y + 1)) {
        __x = d[(long)y + -1] * dVar2;
        local_d0 = floor(__x);
        if (0.5 < __x - local_d0) {
          local_d0 = local_d0 + 1.0;
        }
        if (ABS(local_d0 - __x) <= dVar3) {
          if (((sign_local._7_1_ & 1) == 0) && (1.0 <= f)) {
            if (numerator_local != (double *)0x0) {
              *numerator_local = f;
            }
            f = 0.0;
          }
          if (denominator_local != (double *)0x0) {
            *denominator_local = f * d[(long)y + -1] + local_d0;
          }
          if (a != 0.0) {
            *(double *)a = d[(long)y + -1];
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static
bool ON_IsAnnotationFractionNumber(
  double value,
  bool bImproperFraction,
  double* sign,
  double* proper,
  double* numerator,
  double* denominator
)
{
  if (nullptr != sign)
    *sign = (value < 0.0) ? -1.0 : ((value > 0.0) ? 1.0 : 0.0);
  if (nullptr != proper)
    *proper = 0.0;
  if (nullptr != numerator)
    *numerator = value;
  if (nullptr != denominator)
    *denominator = 1.0;
  if (!ON_IsValid(value))
    return false;

  const double a = fabs(value);
  double i = 0.0;
  const double f = modf(a, &i);

  const double tol = 4.0*ON_EPSILON*a;

  if ( !(f > tol) )
    return false;

  // terminate this list with 0.0.
  const double d[] = { 2.0, 3.0, 4.0, 8.0, 10.0, 16.0, 32.0, 64.0, 128.0, 0.0 };
  for (size_t k = 0; d[k] > 0.0; k++)
  {
    const double y = d[k] * f;
    double x = floor(y);
    if (y - x > 0.5)
      x += 1.0;
    if (!(fabs(x - y) <= tol))
      continue;
    if (false == bImproperFraction && i >= 1.0)
    {
      if (nullptr != proper)
        *proper = i;
      i = 0.0;
    }
    if (nullptr != numerator)
      *numerator = i*d[k] + x;
    if (nullptr != denominator)
      *denominator = d[k];
    return true;
  }

  return false;
}